

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::PushTextureID(ImDrawList *this,ImTextureID texture_id)

{
  ImVector<void_*> *in_RSI;
  void **in_RDI;
  ImDrawList *in_stack_00000030;
  
  ImVector<void_*>::push_back(in_RSI,in_RDI);
  UpdateTextureID(in_stack_00000030);
  return;
}

Assistant:

void ImDrawList::PushTextureID(ImTextureID texture_id)
{
    _TextureIdStack.push_back(texture_id);
    UpdateTextureID();
}